

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O3

uint8_t * __thiscall arangodb::velocypack::Builder::set(Builder *this,Slice *item)

{
  ValueLength *pVVar1;
  byte bVar2;
  pointer pCVar3;
  ValueLength VVar4;
  ValueLength VVar5;
  long lVar6;
  Exception *this_00;
  ulong uVar7;
  ExceptionType type;
  byte *start;
  ulong len;
  
  start = item->_start;
  pCVar3 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->_stack).
       super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
       ._M_impl.super__Vector_impl_data._M_start == pCVar3) ||
     ((this->_start[pCVar3[-1].startPos] != '\x14' && (this->_start[pCVar3[-1].startPos] != '\v'))))
  {
LAB_00105e97:
    if ((0xef < *start & this->options->disallowCustom) != 1) {
      VVar4 = (ValueLength)"\x01\x01"[*start];
      if ((VVar4 == 0) &&
         (VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)item,start), VVar4 == 0)) {
        VVar5 = this->_pos;
        VVar4 = 0;
      }
      else {
        reserve(this,VVar4);
        memcpy(this->_start + this->_pos,item->_start,VVar4);
        VVar5 = this->_pos + VVar4;
        this->_pos = VVar5;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + VVar4;
      }
      return this->_start + (VVar5 - VVar4);
    }
    set();
  }
  else {
    if (this->_keyWritten != false) {
LAB_00105e8f:
      this->_keyWritten = (bool)(this->_keyWritten ^ 1);
      goto LAB_00105e97;
    }
    bVar2 = *start;
    if ((((bVar2 & 0xf8) == 0x28) || ((bVar2 & 0xf0) == 0x30)) || ((ulong)bVar2 - 0x40 < 0x80))
    goto LAB_00105e8f;
  }
  set();
  VVar4 = this->_pos;
  bVar2 = start[0x10];
  pCVar3 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->_stack).
       super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
       ._M_impl.super__Vector_impl_data._M_start != pCVar3) &&
     ((this->_start[pCVar3[-1].startPos] == '\x14' || (this->_start[pCVar3[-1].startPos] == '\v'))))
  {
    if ((this->_keyWritten != false) || ((bVar2 | 2) == 0xe)) {
      this->_keyWritten = (bool)(this->_keyWritten ^ 1);
      goto LAB_00105f7c;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = BuilderKeyMustBeString;
LAB_0010611b:
    Exception::Exception(this_00,type);
LAB_00106120:
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
LAB_00105f7c:
  if (bVar2 == 0x11) {
    if (this->options->disallowCustom == true) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      type = BuilderCustomDisallowed;
      goto LAB_0010611b;
    }
    len = *(ulong *)(start + 8);
    reserve(this,len);
    if (*(void **)start != (void *)0x0) {
      memcpy(this->_start + this->_pos,*(void **)start,len);
    }
    VVar4 = this->_pos;
    VVar5 = VVar4 + len;
  }
  else {
    if (bVar2 == 0xf) {
      len = *(ulong *)(start + 8);
      reserve(this,len + 9);
      appendUInt(this,len,0xbf);
    }
    else {
      if (bVar2 != 0xe) {
        this_00 = (Exception *)__cxa_allocate_exception(0x18);
        Exception::Exception
                  (this_00,BuilderUnexpectedType,
                   "Only ValueType::Binary, ValueType::String and ValueType::Custom are valid for ValuePair argument"
                  );
        goto LAB_00106120;
      }
      len = *(ulong *)(start + 8);
      if (len < 0x7f) {
        reserve(this,len + 1);
        VVar5 = this->_pos;
        this->_pos = VVar5 + 1;
        this->_start[VVar5] = (char)len + '@';
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
      }
      else {
        reserve(this,len + 9);
        VVar5 = this->_pos;
        this->_pos = VVar5 + 1;
        this->_start[VVar5] = 0xbf;
        pVVar1 = &this->_bufferPtr->_size;
        *pVVar1 = *pVVar1 + 1;
        lVar6 = 8;
        uVar7 = len;
        do {
          VVar5 = this->_pos;
          this->_pos = VVar5 + 1;
          this->_start[VVar5] = (uint8_t)uVar7;
          pVVar1 = &this->_bufferPtr->_size;
          *pVVar1 = *pVVar1 + 1;
          uVar7 = uVar7 >> 8;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
    }
    if (len == 0) goto LAB_001060b9;
    memcpy(this->_start + this->_pos,*(void **)start,len);
    VVar5 = this->_pos + len;
  }
  this->_pos = VVar5;
  pVVar1 = &this->_bufferPtr->_size;
  *pVVar1 = *pVVar1 + len;
LAB_001060b9:
  return this->_start + VVar4;
}

Assistant:

uint8_t* Builder::set(Slice const& item) {
  checkKeyHasValidType(item);

  if (VELOCYPACK_UNLIKELY(options->disallowCustom && item.isCustom())) {
    // Custom values explicitly disallowed as a security precaution
    throw Exception(Exception::BuilderCustomDisallowed);
  }

  ValueLength const l = item.byteSize();
  if (l != 0) {
    reserve(l);
    VELOCYPACK_ASSERT(item.start() != nullptr);
    std::memcpy(_start + _pos, item.start(), checkOverflow(l));
    advance(l);
  }
  return _start + _pos - l;
}